

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshifter.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_18ce07::PshifterState::process
          (PshifterState *this,size_t samplesToDo,
          span<const_std::array<float,_1024UL>,_18446744073709551615UL> samplesIn,
          span<std::array<float,_1024UL>,_18446744073709551615UL> samplesOut)

{
  array<double,_1024UL> *__dest;
  array<(anonymous_namespace)::FrequencyBin,_513UL> *__s;
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  double dVar6;
  int iVar7;
  uint uVar8;
  unsigned_long __n2;
  ulong *puVar9;
  ulong uVar10;
  double *pdVar11;
  float *pfVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  size_t sVar18;
  size_t k;
  double dVar19;
  span<std::complex<double>,_18446744073709551615UL> buffer;
  span<std::complex<double>,_18446744073709551615UL> buffer_00;
  span<const_float,_18446744073709551615UL> sVar20;
  double local_40;
  double local_38;
  
  if (samplesToDo != 0) {
    __dest = &this->mFIFO;
    __s = &this->mSynthesisBuffer;
    pdVar1 = &(this->mAnalysisBuffer)._M_elems[0].FreqBin;
    uVar17 = 0;
    do {
      sVar18 = this->mCount;
      uVar10 = samplesToDo - uVar17;
      if (0x400 - sVar18 < samplesToDo - uVar17) {
        uVar10 = 0x400 - sVar18;
      }
      if (uVar10 != 0) {
        pfVar12 = (this->mBufferOut)._M_elems + uVar17;
        lVar14 = 0;
        do {
          *pfVar12 = (float)*(double *)((long)__dest->_M_elems + lVar14 + sVar18 * 8);
          pfVar12 = pfVar12 + 1;
          lVar14 = lVar14 + 8;
        } while (uVar10 * 8 - lVar14 != 0);
      }
      if (0 < (long)uVar10) {
        lVar14 = uVar10 + 1;
        lVar15 = 0;
        do {
          *(double *)((long)__dest->_M_elems + lVar15 * 2 + sVar18 * 8) =
               (double)*(float *)((long)(samplesIn.mData)->_M_elems + lVar15 + uVar17 * 4);
          lVar14 = lVar14 + -1;
          lVar15 = lVar15 + 4;
        } while (1 < lVar14);
      }
      this->mCount = sVar18 + uVar10;
      if (sVar18 + uVar10 < 0x400) break;
      uVar17 = uVar17 + uVar10;
      this->mCount = 0x300;
      lVar14 = 0;
      do {
        pdVar11 = (double *)((long)(this->mFIFO)._M_elems + lVar14);
        dVar3 = *pdVar11;
        dVar6 = *(double *)((long)&(anonymous_namespace)::HannWindow + lVar14);
        pdVar2 = (double *)((this->mFftBuffer)._M_elems[1]._M_value + lVar14 * 2);
        *pdVar2 = pdVar11[1] * *(double *)(lVar14 + 0x22be78);
        pdVar2[1] = 0.0;
        pdVar11 = (double *)((this->mFftBuffer)._M_elems[0]._M_value + lVar14 * 2);
        *pdVar11 = dVar3 * dVar6;
        pdVar11[1] = 0.0;
        lVar14 = lVar14 + 0x10;
      } while (lVar14 != 0x2000);
      buffer.mDataEnd = (pointer)&this->mAnalysisBuffer;
      buffer.mData = (this->mFftBuffer)._M_elems;
      complex_fft(buffer,-1.0);
      lVar14 = 0;
      pdVar11 = pdVar1;
      do {
        dVar3 = pdVar11[-0x801];
        dVar6 = cabs(dVar3);
        dVar3 = carg(dVar3);
        dVar19 = (dVar3 - (this->mLastPhase)._M_elems[lVar14]) - (double)lVar14 * 1.5707963267948966
        ;
        iVar7 = (int)(dVar19 / 3.141592653589793);
        ((FrequencyBin *)(pdVar11 + -1))->Amplitude = dVar6;
        *pdVar11 = ((double)(iVar7 % 2 + iVar7) * -3.141592653589793 + dVar19) / 1.5707963267948966
                   + (double)lVar14;
        (this->mLastPhase)._M_elems[lVar14] = dVar3;
        lVar14 = lVar14 + 1;
        pdVar11 = pdVar11 + 2;
      } while (lVar14 != 0x201);
      memset(__s,0,0x2010);
      uVar4 = this->mPitchShiftI;
      uVar8 = (uint)(0x2007ff / (ulong)uVar4);
      if (0x1ff < uVar8) {
        uVar8 = 0x200;
      }
      dVar3 = this->mPitchShift;
      uVar10 = 0x800;
      uVar13 = 0;
      pdVar11 = pdVar1;
      do {
        uVar16 = uVar10 >> 8 & 0xfffffffffffffff0;
        *(double *)((long)&__s->_M_elems[0].Amplitude + uVar16) =
             ((FrequencyBin *)(pdVar11 + -1))->Amplitude +
             *(double *)((long)&__s->_M_elems[0].Amplitude + uVar16);
        *(double *)((long)&(this->mSynthesisBuffer)._M_elems[0].FreqBin + uVar16) = *pdVar11 * dVar3
        ;
        uVar13 = uVar13 + 1;
        uVar10 = uVar10 + uVar4;
        pdVar11 = pdVar11 + 2;
      } while (uVar13 < uVar8 + 1);
      lVar14 = 0x3024;
      do {
        dVar3 = *(double *)((long)((this->mFftBuffer)._M_elems + -3) + lVar14 * 2) *
                1.5707963267948966 + *(double *)((long)(this->mFIFO)._M_elems + lVar14 + -0x1c);
        *(double *)((long)(this->mFIFO)._M_elems + lVar14 + -0x1c) = dVar3;
        sincos(dVar3,&local_38,&local_40);
        dVar3 = *(double *)((this->mFftBuffer)._M_elems[0]._M_value + lVar14 * 2 + -0x38);
        pdVar11 = (double *)((long)(this->mFIFO)._M_elems + lVar14 * 2 + -0x38);
        *pdVar11 = local_40 * dVar3;
        pdVar11[1] = local_38 * dVar3;
        lVar14 = lVar14 + 8;
      } while (lVar14 != 0x402c);
      lVar14 = 0;
      puVar9 = (ulong *)((this->mFftBuffer)._M_elems[0x1ff]._M_value + 8);
      do {
        uVar10 = *puVar9;
        *(ulong *)((this->mFftBuffer)._M_elems[0x201]._M_value + lVar14) = puVar9[-1];
        *(ulong *)((this->mFftBuffer)._M_elems[0x201]._M_value + lVar14 + 8) =
             uVar10 ^ 0x8000000000000000;
        lVar14 = lVar14 + 0x10;
        puVar9 = puVar9 + -2;
      } while (lVar14 != 0x1ff0);
      buffer_00.mDataEnd = (pointer)&this->mAnalysisBuffer;
      buffer_00.mData = (this->mFftBuffer)._M_elems;
      complex_fft(buffer_00,1.0);
      lVar14 = 0;
      do {
        pdVar11 = (double *)((long)(this->mOutputAccum)._M_elems + lVar14);
        dVar3 = *(double *)((this->mFftBuffer)._M_elems[1]._M_value + lVar14 * 2) *
                *(double *)(lVar14 + 0x22be78) * 0.0009765625 + pdVar11[1];
        auVar5._8_4_ = SUB84(dVar3,0);
        auVar5._0_8_ = *(double *)((this->mFftBuffer)._M_elems[0]._M_value + lVar14 * 2) *
                       *(double *)((long)&(anonymous_namespace)::HannWindow + lVar14) * 0.0009765625
                       + *pdVar11;
        auVar5._12_4_ = (int)((ulong)dVar3 >> 0x20);
        *(undefined1 (*) [16])((long)(this->mOutputAccum)._M_elems + lVar14) = auVar5;
        lVar14 = lVar14 + 0x10;
      } while (lVar14 != 0x2000);
      memmove(__dest,(this->mFIFO)._M_elems + 0x100,0x1800);
      memcpy((this->mFIFO)._M_elems + 0x300,&this->mOutputAccum,0x800);
      memmove(&this->mOutputAccum,(this->mOutputAccum)._M_elems + 0x100,0x1800);
      memset((this->mOutputAccum)._M_elems + 0x300,0,0x800);
    } while (uVar17 < samplesToDo);
  }
  sVar20.mDataEnd = (this->mBufferOut)._M_elems + samplesToDo;
  sVar18 = 0x200;
  if (0x200 < samplesToDo) {
    sVar18 = samplesToDo;
  }
  sVar20.mData = (this->mBufferOut)._M_elems;
  (*MixSamples)(sVar20,samplesOut,this->mCurrentGains,this->mTargetGains,sVar18,0);
  return;
}

Assistant:

void PshifterState::process(const size_t samplesToDo, const al::span<const FloatBufferLine> samplesIn, const al::span<FloatBufferLine> samplesOut)
{
    /* Pitch shifter engine based on the work of Stephan Bernsee.
     * http://blogs.zynaptiq.com/bernsee/pitch-shifting-using-the-ft/
     */

    /* Cycle offset per update expected of each frequency bin (bin 0 is none,
     * bin 1 is x1, bin 2 is x2, etc).
     */
    constexpr double expected_cycles{al::MathDefs<double>::Tau() / OVERSAMP};

    for(size_t base{0u};base < samplesToDo;)
    {
        const size_t todo{minz(STFT_SIZE-mCount, samplesToDo-base)};

        /* Retrieve the output samples from the FIFO and fill in the new input
         * samples.
         */
        auto fifo_iter = mFIFO.begin() + mCount;
        std::transform(fifo_iter, fifo_iter+todo, mBufferOut.begin()+base,
            [](double d) noexcept -> float { return static_cast<float>(d); });

        std::copy_n(samplesIn[0].begin()+base, todo, fifo_iter);
        mCount += todo;
        base += todo;

        /* Check whether FIFO buffer is filled with new samples. */
        if(mCount < STFT_SIZE) break;
        mCount = FIFO_LATENCY;

        /* Time-domain signal windowing, store in FftBuffer, and apply a
         * forward FFT to get the frequency-domain signal.
         */
        for(size_t k{0u};k < STFT_SIZE;k++)
            mFftBuffer[k] = mFIFO[k] * HannWindow[k];
        forward_fft(mFftBuffer);

        /* Analyze the obtained data. Since the real FFT is symmetric, only
         * STFT_HALF_SIZE+1 samples are needed.
         */
        for(size_t k{0u};k < STFT_HALF_SIZE+1;k++)
        {
            const double amplitude{std::abs(mFftBuffer[k])};
            const double phase{std::arg(mFftBuffer[k])};

            /* Compute phase difference and subtract expected phase difference */
            double tmp{(phase - mLastPhase[k]) - static_cast<double>(k)*expected_cycles};

            /* Map delta phase into +/- Pi interval */
            int qpd{double2int(tmp / al::MathDefs<double>::Pi())};
            tmp -= al::MathDefs<double>::Pi() * (qpd + (qpd%2));

            /* Get deviation from bin frequency from the +/- Pi interval */
            tmp /= expected_cycles;

            /* Compute the k-th partials' true frequency and store the
             * amplitude and frequency bin in the analysis buffer.
             */
            mAnalysisBuffer[k].Amplitude = amplitude;
            mAnalysisBuffer[k].FreqBin = static_cast<double>(k) + tmp;

            /* Store the actual phase[k] for the next frame. */
            mLastPhase[k] = phase;
        }

        /* Shift the frequency bins according to the pitch adjustment,
         * accumulating the amplitudes of overlapping frequency bins.
         */
        std::fill(mSynthesisBuffer.begin(), mSynthesisBuffer.end(), FrequencyBin{});
        const size_t bin_count{minz(STFT_HALF_SIZE+1,
            (((STFT_HALF_SIZE+1)<<MixerFracBits) - (MixerFracOne>>1) - 1)/mPitchShiftI + 1)};
        for(size_t k{0u};k < bin_count;k++)
        {
            const size_t j{(k*mPitchShiftI + (MixerFracOne>>1)) >> MixerFracBits};
            mSynthesisBuffer[j].Amplitude += mAnalysisBuffer[k].Amplitude;
            mSynthesisBuffer[j].FreqBin    = mAnalysisBuffer[k].FreqBin * mPitchShift;
        }

        /* Reconstruct the frequency-domain signal from the adjusted frequency
         * bins.
         */
        for(size_t k{0u};k < STFT_HALF_SIZE+1;k++)
        {
            /* Calculate actual delta phase and accumulate it to get bin phase */
            mSumPhase[k] += mSynthesisBuffer[k].FreqBin * expected_cycles;

            mFftBuffer[k] = std::polar(mSynthesisBuffer[k].Amplitude, mSumPhase[k]);
        }
        for(size_t k{STFT_HALF_SIZE+1};k < STFT_SIZE;++k)
            mFftBuffer[k] = std::conj(mFftBuffer[STFT_SIZE-k]);

        /* Apply an inverse FFT to get the time-domain siganl, and accumulate
         * for the output with windowing.
         */
        inverse_fft(mFftBuffer);
        for(size_t k{0u};k < STFT_SIZE;k++)
            mOutputAccum[k] += HannWindow[k]*mFftBuffer[k].real() * (4.0/OVERSAMP/STFT_SIZE);

        /* Shift FIFO and accumulator. */
        fifo_iter = std::copy(mFIFO.begin()+STFT_STEP, mFIFO.end(), mFIFO.begin());
        std::copy_n(mOutputAccum.begin(), STFT_STEP, fifo_iter);
        auto accum_iter = std::copy(mOutputAccum.begin()+STFT_STEP, mOutputAccum.end(),
            mOutputAccum.begin());
        std::fill(accum_iter, mOutputAccum.end(), 0.0);
    }

    /* Now, mix the processed sound data to the output. */
    MixSamples({mBufferOut.data(), samplesToDo}, samplesOut, mCurrentGains, mTargetGains,
        maxz(samplesToDo, 512), 0);
}